

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O2

void nhdp_db_neighbor_addr_remove(nhdp_naddr *naddr)

{
  oonf_class_event(&_naddr_info,naddr,OONF_OBJECT_REMOVED);
  avl_remove(&_naddr_tree,&naddr->_global_node);
  avl_remove(&naddr->neigh->_neigh_addresses,&naddr->_neigh_node);
  oonf_timer_stop(&naddr->_lost_vtime);
  oonf_class_free(&_naddr_info,naddr);
  return;
}

Assistant:

void
nhdp_db_neighbor_addr_remove(struct nhdp_naddr *naddr) {
  /* trigger event */
  oonf_class_event(&_naddr_info, naddr, OONF_OBJECT_REMOVED);

  /* remove from trees */
  avl_remove(&_naddr_tree, &naddr->_global_node);
  avl_remove(&naddr->neigh->_neigh_addresses, &naddr->_neigh_node);

  /* stop timer */
  oonf_timer_stop(&naddr->_lost_vtime);

  /* free memory */
  oonf_class_free(&_naddr_info, naddr);
}